

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

void __thiscall
icu_63::LocaleDisplayNamesImpl::CapitalizationContextSink::put
          (CapitalizationContextSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  char *__s1;
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int i;
  long lVar3;
  int32_t len;
  ResourceTable contexts;
  int local_64;
  char *local_60;
  ResourceTable local_58;
  
  local_60 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = ResourceTable::getKeyAndValue(&local_58,0,&local_60,value), UVar1 != '\0')) {
    i = 1;
    do {
      __s1 = local_60;
      iVar2 = strcmp(local_60,"key");
      if (iVar2 == 0) {
        lVar3 = 4;
LAB_0029c741:
        local_64 = 0;
        iVar2 = (*(value->super_UObject)._vptr_UObject[8])(value,&local_64,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return;
        }
        if ((1 < local_64) &&
           (*(int *)(CONCAT44(extraout_var,iVar2) +
                    (ulong)(this->parent->capitalizationContext !=
                           UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) * 4) != 0)) {
          this->parent->fCapitalization[lVar3] = '\x01';
          this->hasCapitalizationUsage = '\x01';
        }
      }
      else {
        iVar2 = strcmp(__s1,"keyValue");
        if (iVar2 == 0) {
          lVar3 = 5;
          goto LAB_0029c741;
        }
        iVar2 = strcmp(__s1,"languages");
        if (iVar2 == 0) {
          lVar3 = 0;
          goto LAB_0029c741;
        }
        iVar2 = strcmp(__s1,"script");
        if (iVar2 == 0) {
          lVar3 = 1;
          goto LAB_0029c741;
        }
        iVar2 = strcmp(__s1,"territory");
        if (iVar2 == 0) {
          lVar3 = 2;
          goto LAB_0029c741;
        }
        iVar2 = strcmp(__s1,"variant");
        if (iVar2 == 0) {
          lVar3 = 3;
          goto LAB_0029c741;
        }
      }
      UVar1 = ResourceTable::getKeyAndValue(&local_58,i,&local_60,value);
      i = i + 1;
    } while (UVar1 != '\0');
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable contexts = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int i = 0; contexts.getKeyAndValue(i, key, value); ++i) {

            CapContextUsage usageEnum;
            if (uprv_strcmp(key, "key") == 0) {
                usageEnum = kCapContextUsageKey;
            } else if (uprv_strcmp(key, "keyValue") == 0) {
                usageEnum = kCapContextUsageKeyValue;
            } else if (uprv_strcmp(key, "languages") == 0) {
                usageEnum = kCapContextUsageLanguage;
            } else if (uprv_strcmp(key, "script") == 0) {
                usageEnum = kCapContextUsageScript;
            } else if (uprv_strcmp(key, "territory") == 0) {
                usageEnum = kCapContextUsageTerritory;
            } else if (uprv_strcmp(key, "variant") == 0) {
                usageEnum = kCapContextUsageVariant;
            } else {
                continue;
            }

            int32_t len = 0;
            const int32_t* intVector = value.getIntVector(len, errorCode);
            if (U_FAILURE(errorCode)) { return; }
            if (len < 2) { continue; }

            int32_t titlecaseInt = (parent.capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) ? intVector[0] : intVector[1];
            if (titlecaseInt == 0) { continue; }

            parent.fCapitalization[usageEnum] = TRUE;
            hasCapitalizationUsage = TRUE;
        }
    }